

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneloader.h
# Opt level: O2

void json_parse_light<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
               (Scene *s,
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *c)

{
  bool bVar1;
  const_reference pvVar2;
  PointLight *pPVar3;
  undefined1 auStack_38 [12];
  undefined1 local_2c [12];
  PointLight *local_20;
  
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)c,"type");
  bVar1 = nlohmann::operator==<const_char_*,_0>(pvVar2,"PointLight");
  if (bVar1) {
    pPVar3 = (PointLight *)operator_new(0x18);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>
              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)c,"o");
    json_to_v3<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_2c);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>
              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)c,"c");
    json_to_v3<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)auStack_38);
    PointLight::PointLight(pPVar3,(Vector3f *)local_2c,(Vector3f *)auStack_38);
    local_20 = pPVar3;
    std::vector<PointLight*,std::allocator<PointLight*>>::emplace_back<PointLight*>
              ((vector<PointLight*,std::allocator<PointLight*>> *)&s->point_lights,&local_20);
  }
  else {
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)c,"type");
    bVar1 = nlohmann::operator==<const_char_*,_0>(pvVar2,"PointLightDecay");
    if (bVar1) {
      pPVar3 = (PointLight *)operator_new(0x18);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>
                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  *)c,"o");
      json_to_v3<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_2c);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>
                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  *)c,"c");
      json_to_v3<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)auStack_38);
      PointLight::PointLight(pPVar3,(Vector3f *)local_2c,(Vector3f *)auStack_38);
      local_20 = pPVar3;
      std::vector<PointLight*,std::allocator<PointLight*>>::emplace_back<PointLight*>
                ((vector<PointLight*,std::allocator<PointLight*>> *)&s->point_lights_decay,&local_20
                );
    }
  }
  return;
}

Assistant:

void json_parse_light(Scene& s,const T& c)
{
	if(c["type"]=="PointLight")
		s.point_lights.push_back(new PointLight(json_to_v3(c["o"]), json_to_v3(c["c"])));
	else if(c["type"]=="PointLightDecay")
		s.point_lights_decay.push_back(new PointLight(json_to_v3(c["o"]), json_to_v3(c["c"])));
}